

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O2

void diy::mpi::detail::gather
               (communicator *comm,void *dataIn,int count,datatype *type,void *dataOut,int root)

{
  MPI_Datatype poVar1;
  
  poVar1 = (type->handle).data;
  MPI_Gather(dataIn,count,poVar1,dataOut,count,poVar1,root,(comm->comm_).data);
  return;
}

Assistant:

void gather(const communicator& comm,
            const void* dataIn, int count, const datatype& type, void* dataOut,
            int root)
{
#if DIY_HAS_MPI
  MPI_Gather(dataIn, count, mpi_cast(type.handle),
             dataOut, count, mpi_cast(type.handle),
             root, mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)root;
#endif
}